

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundOperatorExpression::Deserialize
          (BoundOperatorExpression *this,Deserializer *deserializer)

{
  ExpressionType type;
  BoundOperatorExpression *this_00;
  pointer pBVar1;
  _Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false> local_60;
  LogicalType return_type;
  LogicalType local_40;
  
  Deserializer::ReadProperty<duckdb::LogicalType>(&return_type,deserializer,200,"return_type");
  this_00 = (BoundOperatorExpression *)operator_new(0x70);
  type = SerializationData::Get<duckdb::ExpressionType>(&deserializer->data);
  LogicalType::LogicalType(&local_40,&return_type);
  BoundOperatorExpression(this_00,type,&local_40);
  local_60._M_head_impl = this_00;
  LogicalType::~LogicalType(&local_40);
  pBVar1 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                         *)&local_60);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xc9,"children",&pBVar1->children);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_60._M_head_impl;
  LogicalType::~LogicalType(&return_type);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundOperatorExpression::Deserialize(Deserializer &deserializer) {
	auto return_type = deserializer.ReadProperty<LogicalType>(200, "return_type");
	auto result = duckdb::unique_ptr<BoundOperatorExpression>(new BoundOperatorExpression(deserializer.Get<ExpressionType>(), std::move(return_type)));
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(201, "children", result->children);
	return std::move(result);
}